

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintCharsAsStringTo(char *begin,size_t len,ostream *os)

{
  char ch;
  bool bVar1;
  CharFormat CVar2;
  ulong uStack_30;
  char cur;
  size_t index;
  bool is_previous_hex;
  ostream *os_local;
  size_t len_local;
  char *begin_local;
  
  std::operator<<(os,"\"");
  bVar1 = false;
  for (uStack_30 = 0; uStack_30 < len; uStack_30 = uStack_30 + 1) {
    ch = begin[uStack_30];
    if ((bVar1) && (bVar1 = IsXDigit(ch), bVar1)) {
      std::operator<<(os,"\" \"");
    }
    CVar2 = PrintAsNarrowStringLiteralTo(ch,os);
    bVar1 = CVar2 == kHexEscape;
  }
  std::operator<<(os,"\"");
  return;
}

Assistant:

static void PrintCharsAsStringTo(const char* begin, size_t len, ostream* os) {
  *os << "\"";
  bool is_previous_hex = false;
  for (size_t index = 0; index < len; ++index) {
    const char cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" \"";
    }
    is_previous_hex = PrintAsNarrowStringLiteralTo(cur, os) == kHexEscape;
  }
  *os << "\"";
}